

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_freeAttributes__sin
          (ColladaParserAutoGen15Private *this,void *attributeData)

{
  if (*(long *)((long)attributeData + 0xf8) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  if (*(long *)((long)attributeData + 0x208) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  sin__AttributeData::~sin__AttributeData((sin__AttributeData *)attributeData);
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_freeAttributes__sin( void* attributeData )
{
    sin__AttributeData* typedAttributeData = static_cast<sin__AttributeData*>(attributeData);
    if (typedAttributeData->_class.data)
    {
        mStackMemoryManager.deleteObject();
    }

    if (typedAttributeData->unknownAttributes.data)
    {
        mStackMemoryManager.deleteObject();
    }


    typedAttributeData->~sin__AttributeData();

    return true;
}